

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O2

string * __thiscall
iDynTree::LinkWrenches::toString_abi_cxx11_
          (string *__return_storage_ptr__,LinkWrenches *this,Model *model)

{
  pointer pWVar1;
  pointer pWVar2;
  ostream *poVar3;
  long linkIndex;
  long lVar4;
  string local_1f8;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  pWVar1 = (this->m_linkWrenches).
           super__Vector_base<iDynTree::Wrench,_std::allocator<iDynTree::Wrench>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pWVar2 = (this->m_linkWrenches).
           super__Vector_base<iDynTree::Wrench,_std::allocator<iDynTree::Wrench>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = 8;
  for (linkIndex = 0; ((long)pWVar1 - (long)pWVar2) / 0x38 != linkIndex; linkIndex = linkIndex + 1)
  {
    poVar3 = std::operator<<(local_1a8,"Wrench for link ");
    Model::getLinkName_abi_cxx11_(&local_1d8,model,linkIndex);
    poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
    poVar3 = std::operator<<(poVar3,":");
    SpatialVector<iDynTree::SpatialForceVector>::toString_abi_cxx11_
              (&local_1f8,
               (SpatialVector<iDynTree::SpatialForceVector> *)
               (&((this->m_linkWrenches).
                  super__Vector_base<iDynTree::Wrench,_std::allocator<iDynTree::Wrench>_>._M_impl.
                  super__Vector_impl_data._M_start)->super_SpatialForceVector + lVar4));
    poVar3 = std::operator<<(poVar3,(string *)&local_1f8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    lVar4 = lVar4 + 0x38;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string LinkWrenches::toString(const Model& model) const
{
   std::stringstream ss;

    size_t nrOfLinks = this->getNrOfLinks();
    for(size_t l=0; l < nrOfLinks; l++)
    {
        ss << "Wrench for link " << model.getLinkName(l) << ":" << this->operator()(l).toString() << std::endl;
    }
    return ss.str();
}